

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.c
# Opt level: O0

int monster_detect(obj *otmp,int mclass)

{
  char cVar1;
  char cVar2;
  level *lev;
  boolean bVar3;
  char *txt;
  bool bVar4;
  int local_54;
  boolean woken;
  monst *pmStack_28;
  int mcnt;
  monst *mtmp;
  int mclass_local;
  obj *otmp_local;
  
  bVar4 = false;
  pmStack_28 = level->monlist;
  do {
    if (pmStack_28 == (monst *)0x0) {
LAB_0017cc99:
      if (bVar4) {
        bVar4 = false;
        cls();
        for (pmStack_28 = level->monlist; lev = level, pmStack_28 != (monst *)0x0;
            pmStack_28 = pmStack_28->nmon) {
          if (0 < pmStack_28->mhp) {
            if ((((mclass == 0) || (pmStack_28->data->mlet == mclass)) ||
                ((pmStack_28->data == mons + 0x76 && (mclass == 0x3b)))) && ('\0' < pmStack_28->mx))
            {
              cVar1 = pmStack_28->mx;
              cVar2 = pmStack_28->my;
              if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
                 ((u.umonnum != u.umonster && (bVar3 = dmgtype(youmonst.data,0x24), bVar3 != '\0')))
                 ) {
                local_54 = (int)pmStack_28->mnum;
              }
              else {
                local_54 = display_rng(0x193);
              }
              dbuf_set(lev,(int)cVar1,(int)cVar2,(rm *)0x0,0,0,0,0,0,0,0,local_54 + 1,0,0);
              if (pmStack_28->data == mons + 0x76) {
                detect_wsegs(pmStack_28,'\0');
              }
            }
            if (((otmp != (obj *)0x0) && ((*(uint *)&otmp->field_0x4a & 1) != 0)) &&
               (((*(uint *)&pmStack_28->field_0x60 >> 0x13 & 1) != 0 ||
                ((*(uint *)&pmStack_28->field_0x60 >> 0x12 & 1) == 0)))) {
              pmStack_28->mfrozen = '\0';
              *(uint *)&pmStack_28->field_0x60 = *(uint *)&pmStack_28->field_0x60 & 0xfff7ffff;
              *(uint *)&pmStack_28->field_0x60 =
                   *(uint *)&pmStack_28->field_0x60 & 0xfffbffff | 0x40000;
              bVar4 = true;
            }
          }
        }
        display_self();
        pline("You sense the presence of monsters.");
        if (bVar4) {
          pline("Monsters sense the presence of you.");
        }
        (*windowprocs.win_pause)(P_MAP);
        doredraw();
        if (((byte)u._1052_1_ >> 1 & 1) != 0) {
          under_water(2);
        }
        if (((byte)u._1052_1_ >> 5 & 1) != 0) {
          under_ground(2);
        }
        otmp_local._4_4_ = 0;
      }
      else {
        if (otmp != (obj *)0x0) {
          bVar4 = false;
          if (u.uprops[0x23].intrinsic != 0) {
            bVar4 = true;
            if ((u.uprops[0x24].extrinsic == 0) && (bVar4 = false, u.umonnum != u.umonster)) {
              bVar3 = dmgtype(youmonst.data,0x24);
              bVar4 = bVar3 != '\0';
            }
            bVar4 = (bool)(bVar4 ^ 1);
          }
          txt = "You feel threatened.";
          if (bVar4) {
            txt = "You get the heebie jeebies.";
          }
          strange_feeling(otmp,txt);
        }
        otmp_local._4_4_ = 1;
      }
      return otmp_local._4_4_;
    }
    if (0 < pmStack_28->mhp) {
      bVar4 = true;
      goto LAB_0017cc99;
    }
    pmStack_28 = pmStack_28->nmon;
  } while( true );
}

Assistant:

int monster_detect(struct obj *otmp,	/* detecting object (if any) */
		   int mclass		/* monster class, 0 for all */)
{
    struct monst *mtmp;
    int mcnt = 0;


    /* Note: This used to just check level->monlist for a non-zero value
     * but in versions since 3.3.0 level->monlist can test TRUE due to the
     * presence of dmons, so we have to find at least one
     * with positive hit-points to know for sure.
     */
    for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon)
    	if (!DEADMONSTER(mtmp)) {
		mcnt++;
		break;
	}

    if (!mcnt) {
	if (otmp)
	    strange_feeling(otmp, Hallucination ?
			    "You get the heebie jeebies." :
			    "You feel threatened.");
	return 1;
    } else {
	boolean woken = FALSE;

	cls();
	for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon) {
	    if (DEADMONSTER(mtmp)) continue;
	    if (!mclass || mtmp->data->mlet == mclass ||
		(mtmp->data == &mons[PM_LONG_WORM] && mclass == S_WORM_TAIL))
		    if (mtmp->mx > 0) {
			dbuf_set(level, mtmp->mx, mtmp->my, NULL, S_unexplored,
				 0, 0, 0, 0, 0,
				 0, dbuf_monid(mtmp), 0, 0);
			/* don't be stingy - display entire worm */
			if (mtmp->data == &mons[PM_LONG_WORM])
			    detect_wsegs(mtmp,0);
		    }
	    if (otmp && otmp->cursed &&
		(mtmp->msleeping || !mtmp->mcanmove)) {
		mtmp->msleeping = mtmp->mfrozen = 0;
		mtmp->mcanmove = 1;
		woken = TRUE;
	    }
	}
	display_self();
	pline("You sense the presence of monsters.");
	if (woken)
	    pline("Monsters sense the presence of you.");
	win_pause_output(P_MAP);
	doredraw();
	if (Underwater) under_water(2);
	if (u.uburied) under_ground(2);
    }
    return 0;
}